

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O3

void __thiscall
SemanticAnalyserTest_CallArgumentTypeMismatchThrows2_Test::
~SemanticAnalyserTest_CallArgumentTypeMismatchThrows2_Test
          (SemanticAnalyserTest_CallArgumentTypeMismatchThrows2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, CallArgumentTypeMismatchThrows2)
{
  std::string source = R"SRC(
  fn addOne(x: f32): f32
  {
    ret x+1;
  }

  fn main(): f32
  {
    addOne(\(x:f32):f32 = { ret x; });
    ret 0;
  }
  )SRC";
  throwTest(source);
}